

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::SkipAutoProfileForCoroutine(FunctionBody *this)

{
  bool bVar1;
  undefined1 local_11;
  FunctionBody *this_local;
  
  bVar1 = FunctionProxy::IsCoroutine((FunctionProxy *)this);
  local_11 = 0;
  if (bVar1) {
    local_11 = DAT_01ea4188;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
    FunctionBody::SkipAutoProfileForCoroutine() const
    {
        return this->IsCoroutine() && CONFIG_FLAG(JitES6Generators);
    }